

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::file::load(file *this)

{
  context *in_stack_00000108;
  file *in_stack_00000110;
  
  load(in_stack_00000110,in_stack_00000108);
  return;
}

Assistant:

void file::load(http::context &context)
{
	pre_load(context);
	set(false);
	valid(true);
	if(name().empty())
		return;
	std::string const field_name = name();
	std::vector<booster::shared_ptr<http::file> > files = context.request().files();
	for(unsigned i=0;i<files.size();i++) {
		if(files[i]->name()==field_name) {
			file_=files[i];
			set(true);
			break;
		}
	}
	if(set()) {
		std::string file_name = file_->filename();
		if(check_charset_) {
			size_t count=0;
			if(!encoding::valid(context.locale(),file_name.c_str(),file_name.c_str()+file_name.size(),count)) {
				valid(false);
			}
		}
	}
}